

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O2

void __thiscall
MonteCarloPricer::priceAndPrint<AsianArithmeticPut>
          (MonteCarloPricer *this,BlackScholesModel *model,AsianArithmeticPut *option)

{
  ostream *poVar1;
  PriceCI PStack_38;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BlackScholesModel::print(model);
  (**(option->super_PathDependentOption).super_Option._vptr_Option)(option);
  poVar1 = std::operator<<((ostream *)&std::cout," Number of paths: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_sims);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," Number of steps: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->n_steps);
  std::endl<char,std::char_traits<char>>(poVar1);
  price<AsianArithmeticPut>(&PStack_38,this,model,option);
  PriceCI::print_CI(&PStack_38);
  return;
}

Assistant:

inline void MonteCarloPricer::priceAndPrint(BlackScholesModel const& model, T const& option)
{
	std::cout << std::endl;
	model.print();
	option.print();
	std::cout << " Number of paths: " << num_sims << std::endl;
	std::cout << " Number of steps: " << n_steps << std::endl;
	price(model, option).print_CI();
}